

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall Catch::AssertionResult::getExpression_abi_cxx11_(AssertionResult *this)

{
  StringRef rhs;
  bool bVar1;
  char *in_RSI;
  string *in_RDI;
  string *expr;
  string *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  StringRef::size((StringRef *)(in_RSI + 0x20));
  std::__cxx11::string::reserve((ulong)this_00);
  bVar1 = isFalseTest(*(int *)(in_RSI + 0x30));
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)this_00,"!(");
  }
  rhs.m_size = (size_type)this_00;
  rhs.m_start = in_RSI;
  operator+=(in_RDI,rhs);
  bVar1 = isFalseTest(*(int *)(in_RSI + 0x30));
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)this_00,')');
  }
  return in_RDI;
}

Assistant:

std::string AssertionResult::getExpression() const {
        // Possibly overallocating by 3 characters should be basically free
        std::string expr; expr.reserve(m_info.capturedExpression.size() + 3);
        if (isFalseTest(m_info.resultDisposition)) {
            expr += "!(";
        }
        expr += m_info.capturedExpression;
        if (isFalseTest(m_info.resultDisposition)) {
            expr += ')';
        }
        return expr;
    }